

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

Iterator * __thiscall iDynTree::SensorsList::Iterator::operator++(Iterator *this)

{
  bool bVar1;
  iterator iVar2;
  Iterator *in_RDI;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *in_stack_ffffffffffffffb8;
  iterator *this_00;
  __normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
  *in_stack_ffffffffffffffc0;
  iterator *__lhs;
  bool local_31;
  
  __gnu_cxx::
  __normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
  ::operator++(&in_RDI->internalIterator);
  __gnu_cxx::
  __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
  ::operator->(&in_RDI->externalIterator);
  std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::end
            (in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator>=
                    (in_stack_ffffffffffffffc0,
                     (__normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
                      *)in_stack_ffffffffffffffb8);
  if (bVar1) {
    do {
      __gnu_cxx::
      __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
      ::operator++(&in_RDI->externalIterator);
      __lhs = &in_RDI->externalIterator;
      std::
      vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
      ::end((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
             *)in_stack_ffffffffffffffb8);
      bVar1 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                                *)in_stack_ffffffffffffffb8);
      local_31 = false;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
        ::operator->(&in_RDI->externalIterator);
        local_31 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::empty
                             ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
                              in_RDI);
      }
    } while (local_31 != false);
    this_00 = &in_RDI->externalIterator;
    std::
    vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
    ::end((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           *)this_00);
    bVar1 = __gnu_cxx::operator!=(__lhs,this_00);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
      ::operator->(&in_RDI->externalIterator);
      iVar2 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::begin
                        ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)this_00)
      ;
      (in_RDI->internalIterator)._M_current = iVar2._M_current;
    }
  }
  return in_RDI;
}

Assistant:

SensorsList::Iterator& SensorsList::Iterator::operator++()
    {
        ++internalIterator;
        if (internalIterator >= externalIterator->end()) {
            //end of inner list.
            //Move to next list
            do {
                ++externalIterator;
            } while (externalIterator != iteratingList.end() &&
                     externalIterator->empty());

            if (externalIterator != iteratingList.end()) {
                internalIterator = externalIterator->begin();
            }
        }
        return *this;
    }